

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody
          (VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *this)

{
  KeyValue *pKVar1;
  byte bVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  MapDynamicFieldInfo<const_google::protobuf::Message> info;
  _func_int **pp_Var5;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *pVVar6;
  CppStringType CVar7;
  int iVar8;
  uint32_t *puVar9;
  SooRep *this_00;
  RepeatedPtrIterator<const_google::protobuf::Message> RVar10;
  RepeatedPtrField<google::protobuf::Message> *pRVar11;
  Nonnull<const_char_*> pcVar12;
  Descriptor *this_01;
  FieldDescriptor *val_f;
  ExtensionSet *pEVar13;
  undefined8 extraout_RAX;
  bool bVar14;
  Reflection *this_02;
  FieldDescriptor *this_03;
  KeyValue *pKVar15;
  long lVar16;
  char *message;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_04;
  KeyValue *pKVar17;
  uint uVar18;
  long lVar19;
  Metadata MVar20;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::Message>_>
  iVar21;
  string_view str;
  string_view str_00;
  int count;
  AssertionResult gtest_ar;
  Descriptor *extendee;
  _func_int **local_110;
  InternalMetadata local_108;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_100;
  FieldDescriptor *local_f8;
  RepeatedPtrField<google::protobuf::Message> *local_f0;
  uint32_t *local_e0;
  undefined1 local_d8 [4];
  int local_d4;
  AssertHelper local_d0;
  _Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  local_c8;
  FieldDescriptor *local_c0;
  RepeatedPtrField<google::protobuf::Message> *local_b8;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_b0;
  undefined1 local_a8 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_a0;
  FieldDescriptor *local_98;
  FieldDescriptor *pFStack_90;
  DescriptorPool *local_88;
  MapFieldBase *pMStack_80;
  FieldDescriptor *local_78;
  TcParseTableBase *local_70;
  VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *local_68;
  uint32_t *local_60;
  ReflectionSchema *local_58;
  long local_50;
  _func_int *local_48;
  DescriptorPool *local_40;
  DescriptorNames local_38;
  
  local_48 = (_func_int *)(local_d8 + 4);
  local_d4 = 0;
  this_04._M_head_impl = (LogMessageData *)(this->super_VisitFieldsTest).message_;
  local_110 = &local_48;
  local_d8 = (undefined1  [4])0x400;
  MVar20 = Message::GetMetadata((Message *)this_04._M_head_impl);
  this_02 = MVar20.reflection;
  if (0 < (this_02->schema_).weak_field_map_offset_) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_00._M_str = "weak fields are not supported";
    str_00._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_a8,str_00);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8)
    ;
  }
  local_68 = this;
  if ((this_02->schema_).has_bits_offset_ == -1) {
    puVar9 = (uint32_t *)0x0;
  }
  else {
    puVar9 = Reflection::GetHasBits(this_02,(Message *)this_04._M_head_impl);
  }
  pDVar3 = this_02->descriptor_;
  local_50 = (long)pDVar3->field_count_;
  if (0 < local_50) {
    local_58 = &this_02->schema_;
    local_60 = (this_02->schema_).has_bit_indices_;
    lVar16 = 0;
    local_e0 = puVar9;
    local_b0._M_head_impl = this_04._M_head_impl;
    do {
      if (lVar16 < pDVar3->field_count_) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar16,(long)pDVar3->field_count_,"index < field_count()");
      }
      if (pcVar12 != (Nonnull<const_char_*>)0x0) {
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
LAB_008f8acc:
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
LAB_008f8ad9:
        protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
      if (((pDVar3->fields_[lVar16].options_)->field_0)._impl_.weak_ == true) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        str._M_str = "weak fields are not supported";
        str._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_108,str);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_108);
      }
      this_03 = pDVar3->fields_ + lVar16;
      if ((local_d8 != (undefined1  [4])0xffffffff) &&
         (((uint)local_d8 >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_03->type_ * 4) & 0x1f) & 1)
          == 0)) goto LAB_008f86fb;
      bVar2 = this_03->field_0x1;
      bVar14 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar14) {
        pcVar12 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar14,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar12 != (Nonnull<const_char_*>)0x0) goto LAB_008f8acc;
      if ((this_03->field_0x1 & 0x20) == 0) {
        bVar14 = ReflectionSchema::InRealOneof(local_58,this_03);
        if (bVar14) {
          pOVar4 = (this_03->scope_).containing_oneof;
          if (pOVar4 == (OneofDescriptor *)0x0) goto LAB_008f8ad9;
          if ((ulong)*(uint *)((long)&((this_04._M_head_impl)->entry).full_filename_._M_len +
                              (long)((int)((ulong)((long)pOVar4 -
                                                  (long)pOVar4->containing_type_->oneof_decls_) >> 3
                                          ) * -0x49249249) * 4 +
                              (ulong)(uint)(this_02->schema_).oneof_case_offset_) !=
              (long)this_03->number_) goto LAB_008f86fb;
          bVar2 = this_03->type_;
          if (0x12 < bVar2) goto LAB_008f8afb;
          if ((0x7e1feU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008f86fb;
          if ((0xc00U >> (bVar2 & 0x1f) & 1) == 0) {
            if ((0x1200U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_008f8afb;
LAB_008f854f:
            FieldDescriptor::cpp_string_type(this_03);
          }
          else {
LAB_008f85bb:
            pp_Var5 = local_110;
            Reflection::GetMessage
                      (this_02,(Message *)this_04._M_head_impl,this_03,(MessageFactory *)0x0);
            *(int *)*pp_Var5 = *(int *)*pp_Var5 + 1;
            puVar9 = local_e0;
          }
        }
        else if ((puVar9 == (uint32_t *)0x0) || (uVar18 = local_60[lVar16], uVar18 == 0xffffffff)) {
          bVar14 = Reflection::HasFieldSingular(this_02,(Message *)this_04._M_head_impl,this_03);
          if (bVar14) goto LAB_008f851c;
        }
        else if ((puVar9[uVar18 >> 5] >> (uVar18 & 0x1f) & 1) != 0) {
LAB_008f851c:
          bVar2 = this_03->type_;
          if (bVar2 < 0x13) {
            if ((0x7e1feU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008f86fb;
            if ((0xc00U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008f85bb;
            if ((0x1200U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008f854f;
          }
LAB_008f8af6:
          internal::_GLOBAL__N_1::
          VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody();
LAB_008f8afb:
          internal::_GLOBAL__N_1::
          VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody();
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 8));
          if ((Reflection *)local_108.ptr_ != (Reflection *)0x0) {
            (**(code **)(*(long *)local_108.ptr_ + 8))();
          }
          local_108.ptr_ = 0;
          if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )_Stack_a0._M_head_impl !=
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&_Stack_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Stack_a0._M_head_impl);
          }
          _Unwind_Resume(extraout_RAX);
        }
        goto LAB_008f86fb;
      }
      switch(this_03->type_) {
      case '\x01':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\x02':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\x03':
      case '\x10':
      case '\x12':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\x04':
      case '\x06':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\x05':
      case '\x0e':
      case '\x0f':
      case '\x11':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\a':
      case '\r':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\b':
        this_00 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                             (this_02,(Message *)this_04._M_head_impl,this_03)->soo_rep_;
        break;
      case '\t':
      case '\f':
        CVar7 = FieldDescriptor::cpp_string_type(this_03);
        if (CVar7 - kView < 3) {
          Reflection::GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                    (this_02,(Message *)this_04._M_head_impl,this_03);
        }
        goto LAB_008f86fb;
      case '\n':
        pRVar11 = Reflection::
                  GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                            (this_02,(Message *)this_04._M_head_impl,this_03);
        if ((pRVar11->super_RepeatedPtrFieldBase).current_size_ != 0) {
          local_108.ptr_ = (intptr_t)this_02;
          local_100._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl =
               (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )this_04._M_head_impl;
          local_f8 = this_03;
          local_f0 = pRVar11;
          iVar21 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                   ::Get((RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                          *)&local_108);
          pp_Var5 = local_110;
          puVar9 = local_e0;
          this_04._M_head_impl = local_b0._M_head_impl;
          for (RVar10 = iVar21.begin_iterator_.it_; local_110 = pp_Var5, local_e0 = puVar9,
              local_b0._M_head_impl = this_04._M_head_impl,
              RVar10.it_ != iVar21.end_iterator_.it_.it_; RVar10.it_ = RVar10.it_ + 1) {
            DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar10.it_);
            *(int *)*pp_Var5 = *(int *)*pp_Var5 + 1;
            pp_Var5 = local_110;
            puVar9 = local_e0;
            this_04._M_head_impl = local_b0._M_head_impl;
          }
        }
        goto LAB_008f86fb;
      case '\v':
        bVar14 = FieldDescriptor::is_map_message_type(this_03);
        if (bVar14) {
          local_70 = (TcParseTableBase *)
                     Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               (this_02,(Message *)this_04._M_head_impl,this_03);
          iVar8 = MapFieldBase::size((MapFieldBase *)local_70);
          if (iVar8 != 0) {
            this_01 = FieldDescriptor::message_type(this_03);
            local_78 = Descriptor::map_key(this_01);
            puVar9 = local_e0;
            val_f = Descriptor::map_value(this_01);
            MapDynamicFieldInfo<const_google::protobuf::Message>::MapDynamicFieldInfo
                      ((MapDynamicFieldInfo<const_google::protobuf::Message> *)local_a8,this_02,
                       (Message *)this_04._M_head_impl,this_03,local_78,val_f,
                       (MapFieldBase *)local_70);
            info.reflection._1_7_ = local_a8._1_7_;
            info.reflection._0_1_ = local_a8[0];
            info.message = (Message *)_Stack_a0._M_head_impl;
            info.field = local_98;
            info.key = pFStack_90;
            info.value = (FieldDescriptor *)local_88;
            info.const_map_field = pMStack_80;
            ReflectionVisit::
            VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)
            ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)&local_110,info);
          }
        }
        else {
          pRVar11 = Reflection::
                    GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_02,(Message *)this_04._M_head_impl,this_03);
          if ((pRVar11->super_RepeatedPtrFieldBase).current_size_ != 0) {
            local_108.ptr_ = (intptr_t)this_02;
            local_100._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl =
                 (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )this_04._M_head_impl;
            local_f8 = this_03;
            local_f0 = pRVar11;
            iVar21 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                     ::Get((RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                            *)&local_108);
            pp_Var5 = local_110;
            puVar9 = local_e0;
            this_04._M_head_impl = local_b0._M_head_impl;
            for (RVar10 = iVar21.begin_iterator_.it_; local_110 = pp_Var5, local_e0 = puVar9,
                local_b0._M_head_impl = this_04._M_head_impl,
                RVar10.it_ != iVar21.end_iterator_.it_.it_; RVar10.it_ = RVar10.it_ + 1) {
              DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar10.it_);
              *(int *)*pp_Var5 = *(int *)*pp_Var5 + 1;
              pp_Var5 = local_110;
              puVar9 = local_e0;
              this_04._M_head_impl = local_b0._M_head_impl;
            }
          }
        }
        goto LAB_008f86fb;
      default:
        internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test
        ::TestBody();
        goto LAB_008f8af6;
      }
      SooRep::size(this_00,(undefined1  [16])
                           ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
LAB_008f86fb:
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_50);
  }
  pVVar6 = local_68;
  if ((this_02->schema_).extensions_offset_ != -1) {
    pEVar13 = Reflection::GetExtensionSet(this_02,(Message *)this_04._M_head_impl);
    local_38.payload_ = (char *)this_02->descriptor_;
    local_b8 = (RepeatedPtrField<google::protobuf::Message> *)&local_38;
    local_40 = this_02->descriptor_pool_;
    local_c0 = (FieldDescriptor *)&local_40;
    local_d0.data_ = (AssertHelperData *)local_d8;
    local_c8.
    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                    )&local_110;
    lVar16 = (long)(short)pEVar13->flat_size_;
    pKVar15 = (pEVar13->map_).flat;
    if (lVar16 < 0) {
      internal::_GLOBAL__N_1::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::
      TestBody();
    }
    else {
      lVar19 = lVar16 * 0x20;
      pKVar1 = pKVar15 + lVar16;
      pKVar17 = pKVar15;
      local_108.ptr_ = (intptr_t)local_d0.data_;
      local_100._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )(tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        )local_c8.
                         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                         ._M_head_impl;
      local_f8 = local_c0;
      local_f0 = local_b8;
      if (pEVar13->flat_size_ != 0) {
        uVar18 = 0;
        do {
          lVar19 = lVar19 + -0x20;
          ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
          pKVar17 = pKVar17 + 1;
          if (lVar19 == 0) break;
          bVar14 = uVar18 < 0xf;
          uVar18 = uVar18 + 1;
        } while (bVar14);
      }
      if (pKVar17 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_108,pKVar15->first,&pKVar15->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
          pKVar15 = pKVar15 + 1;
          pKVar17 = pKVar17 + 1;
        } while (pKVar17 != pKVar1);
      }
      if (pKVar15 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(&local_108,pKVar15->first,&pKVar15->second);
          pKVar15 = pKVar15 + 1;
        } while (pKVar15 != pKVar1);
      }
    }
  }
  iVar8 = CountAllMessageFieldsViaListFields
                    ((pVVar6->super_VisitFieldsTest).reflection_,
                     (pVVar6->super_VisitFieldsTest).message_);
  local_108.ptr_._0_4_ = iVar8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a8,"count",
             "CountAllMessageFieldsViaListFields(reflection_, *message_)",(int *)(local_d8 + 4),
             (int *)&local_108);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if ((_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)
        _Stack_a0._M_head_impl ==
        (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0)
    {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (char *)((_Stack_a0._M_head_impl)->entry).full_filename_._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_d8 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x71,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_d8 + 8),(Message *)&local_108)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_d8 + 8));
    if ((long *)local_108.ptr_ != (long *)0x0) {
      (**(code **)(*(long *)local_108.ptr_ + 8))();
    }
  }
  if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
       )_Stack_a0._M_head_impl !=
      (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_a0._M_head_impl);
  }
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitMessageFieldsCountIncludesRepeatedElements) {
  int count = 0;
  VisitMessageFields(*message_, [&](const Message& msg) { ++count; });

  EXPECT_EQ(count, CountAllMessageFieldsViaListFields(reflection_, *message_));
}